

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist_wc.c
# Opt level: O0

slist_wc * slist_wc_append(slist_wc *list,char *data)

{
  curl_slist *pcVar1;
  curl_slist *new_item;
  char *data_local;
  slist_wc *list_local;
  
  pcVar1 = (curl_slist *)curl_slist_append(0,data);
  if (pcVar1 == (curl_slist *)0x0) {
    list_local = (slist_wc *)0x0;
  }
  else if (list == (slist_wc *)0x0) {
    list_local = (slist_wc *)malloc(0x10);
    if (list_local == (slist_wc *)0x0) {
      curl_slist_free_all(pcVar1);
      list_local = (slist_wc *)0x0;
    }
    else {
      list_local->first = pcVar1;
      list_local->last = pcVar1;
    }
  }
  else {
    list->last->next = pcVar1;
    list->last = list->last->next;
    list_local = list;
  }
  return list_local;
}

Assistant:

struct slist_wc *slist_wc_append(struct slist_wc *list,
                                 const char *data)
{
  struct curl_slist *new_item = curl_slist_append(NULL, data);

  if(!new_item)
    return NULL;

  if(!list) {
    list = malloc(sizeof(struct slist_wc));

    if(!list) {
      curl_slist_free_all(new_item);
      return NULL;
    }

    list->first = new_item;
    list->last = new_item;
    return list;
  }

  list->last->next = new_item;
  list->last = list->last->next;
  return list;
}